

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

Color * __thiscall World::getRadiance(World *this,Vector3 *P,Vector3 *N)

{
  double in_RCX;
  Light *in_RDX;
  long *in_RSI;
  Color *in_RDI;
  double dVar1;
  Vector3 *in_stack_00000020;
  Vector3 *in_stack_00000028;
  Vector3 *in_stack_00000030;
  World *in_stack_00000038;
  Vector3 O;
  int j;
  int i;
  double res;
  Vector3 *this_00;
  Vector3 *in_stack_ffffffffffffff48;
  Vector3 local_88;
  Vector3 local_70;
  Vector3 local_48;
  int local_30;
  int local_2c;
  double j_00;
  
  j_00 = 0.0;
  for (local_2c = -(int)in_RSI[0x13]; local_2c <= (int)in_RSI[0x13]; local_2c = local_2c + 1) {
    for (local_30 = -(int)in_RSI[0x13]; local_30 <= (int)in_RSI[0x13]; local_30 = local_30 + 1) {
      in_stack_ffffffffffffff48 = &local_48;
      Light::getPos(in_RDX,in_RCX,j_00);
      dVar1 = getRadianceWithLight
                        (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
      j_00 = dVar1 + j_00;
      Vector3::~Vector3(&local_48);
    }
  }
  dVar1 = (double)((int)in_RSI[0x13] * 2 + 1);
  this_00 = &local_88;
  Vector3::Vector3(this_00,(j_00 / dVar1) / dVar1);
  ::operator*(in_stack_ffffffffffffff48,this_00);
  Vector3::power((Vector3 *)(*in_RSI + 0x50));
  operator/(in_stack_ffffffffffffff48,&this_00->x);
  Vector3::~Vector3(&local_70);
  Vector3::~Vector3(&local_88);
  return in_RDI;
}

Assistant:

Color World::getRadiance(const Vector3 &P, const Vector3 &N)
{
    double res = 0;
    for (int i = -SHADE_QUALITY; i <= SHADE_QUALITY; ++i) {
        for (int j = -SHADE_QUALITY; j <= SHADE_QUALITY; ++j) {
            Vector3 O = light->getPos(i*1.0/SHADE_QUALITY, j*1.0/SHADE_QUALITY);
            res += getRadianceWithLight(P, N, O);
        }
    }
    return res / (2 * SHADE_QUALITY + 1) / (2 * SHADE_QUALITY + 1) * light->color / light->color.power();
}